

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

void cvSensFreeVectors(CVodeMem cv_mem)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  uVar1 = cv_mem->cv_qmax_allocS;
  N_VDestroyVectorArray(cv_mem->cv_yS,cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_ewtS,cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_acorS,cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_tempvS,cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_ftempS,cv_mem->cv_Ns);
  if (-1 < (int)uVar1) {
    lVar3 = 0;
    do {
      N_VDestroyVectorArray(cv_mem->cv_znS[lVar3],cv_mem->cv_Ns);
      lVar3 = lVar3 + 1;
    } while ((ulong)uVar1 + 1 != lVar3);
  }
  free(cv_mem->cv_pbar);
  cv_mem->cv_pbar = (sunrealtype *)0x0;
  free(cv_mem->cv_plist);
  cv_mem->cv_plist = (int *)0x0;
  iVar2 = cv_mem->cv_Ns;
  lVar3 = (long)(int)((uVar1 + 6) * iVar2);
  cv_mem->cv_lrw = cv_mem->cv_lrw - (cv_mem->cv_lrw1 * lVar3 + (long)iVar2);
  cv_mem->cv_liw = cv_mem->cv_liw - (lVar3 * cv_mem->cv_liw1 + (long)iVar2);
  if (cv_mem->cv_VabstolSMallocDone != 0) {
    N_VDestroyVectorArray(cv_mem->cv_VabstolS);
    cv_mem->cv_lrw = cv_mem->cv_lrw - cv_mem->cv_lrw1 * (long)cv_mem->cv_Ns;
    cv_mem->cv_liw = cv_mem->cv_liw - (long)cv_mem->cv_Ns * cv_mem->cv_liw1;
  }
  if (cv_mem->cv_SabstolSMallocDone != 0) {
    free(cv_mem->cv_SabstolS);
    cv_mem->cv_SabstolS = (sunrealtype *)0x0;
    cv_mem->cv_lrw = cv_mem->cv_lrw - (long)cv_mem->cv_Ns;
  }
  cv_mem->cv_VabstolSMallocDone = 0;
  cv_mem->cv_SabstolSMallocDone = 0;
  return;
}

Assistant:

static void cvSensFreeVectors(CVodeMem cv_mem)
{
  int j, maxord;

  maxord = cv_mem->cv_qmax_allocS;

  N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);

  for (j = 0; j <= maxord; j++)
  {
    N_VDestroyVectorArray(cv_mem->cv_znS[j], cv_mem->cv_Ns);
  }

  free(cv_mem->cv_pbar);
  cv_mem->cv_pbar = NULL;
  free(cv_mem->cv_plist);
  cv_mem->cv_plist = NULL;

  cv_mem->cv_lrw -= (maxord + 6) * cv_mem->cv_Ns * cv_mem->cv_lrw1 +
                    cv_mem->cv_Ns;
  cv_mem->cv_liw -= (maxord + 6) * cv_mem->cv_Ns * cv_mem->cv_liw1 +
                    cv_mem->cv_Ns;

  if (cv_mem->cv_VabstolSMallocDone)
  {
    N_VDestroyVectorArray(cv_mem->cv_VabstolS, cv_mem->cv_Ns);
    cv_mem->cv_lrw -= cv_mem->cv_Ns * cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_Ns * cv_mem->cv_liw1;
  }
  if (cv_mem->cv_SabstolSMallocDone)
  {
    free(cv_mem->cv_SabstolS);
    cv_mem->cv_SabstolS = NULL;
    cv_mem->cv_lrw -= cv_mem->cv_Ns;
  }
  cv_mem->cv_VabstolSMallocDone = SUNFALSE;
  cv_mem->cv_SabstolSMallocDone = SUNFALSE;
}